

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

int __thiscall xmrig::Client::resolve(Client *this,String *host)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  uint uVar6;
  String *in_RSI;
  Client *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  SocketState in_stack_ffffffffffffffdc;
  int local_4;
  
  setState(in_RDI,in_stack_ffffffffffffffdc);
  RecvBuf<16384UL>::reset(&in_RDI->m_recvBuf);
  if ((in_RDI->super_BaseClient).m_failures == -1) {
    (in_RDI->super_BaseClient).m_failures = 0;
  }
  bVar1 = Dns::resolve((Dns *)in_RDI,
                       (String *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (bVar1) {
    local_4 = 0;
  }
  else {
    bVar1 = BaseClient::isQuiet(&in_RDI->super_BaseClient);
    if (!bVar1) {
      pcVar4 = String::data(in_RSI);
      uVar2 = Pool::port((Pool *)0x1bf894);
      uVar6 = (uint)uVar2;
      iVar3 = Dns::status(in_RDI->m_dns);
      uVar5 = uv_strerror(iVar3);
      Log::print(ERR,"[%s:%u] getaddrinfo error: \"%s\"",pcVar4,(ulong)uVar6,uVar5);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int xmrig::Client::resolve(const String &host)
{
    setState(HostLookupState);

    m_recvBuf.reset();

    if (m_failures == -1) {
        m_failures = 0;
    }

    if (!m_dns->resolve(host)) {
        if (!isQuiet()) {
            LOG_ERR("[%s:%u] getaddrinfo error: \"%s\"", host.data(), m_pool.port(), uv_strerror(m_dns->status()));
        }

        return 1;
    }

    return 0;
}